

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  double dVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  LuaType LVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  TValue *f;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  GCObject *pGVar12;
  GCObject *pGVar13;
  char *pcVar14;
  Table *pTVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar10 = t1->tt_;
  uVar11 = uVar10 & 0x7f;
  uVar3 = t2->tt_;
  uVar9 = (uint)uVar3;
  if (uVar11 != (uVar9 & 0x7f)) {
    uVar11 = uVar10 & 0xf ^ 3;
    pGVar12 = (GCObject *)(ulong)uVar11;
    if ((uVar3 & 0xf) != 3 || uVar11 != 0) {
      return 0;
    }
    pGVar13 = (GCObject *)0x1;
    if (uVar10 == 3) {
      dVar1 = (t1->value_).n;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar1;
      auVar19 = vroundsd_avx(auVar19,auVar19,9);
      dVar17 = auVar19._0_8_;
      if ((dVar17 == dVar1) && (!NAN(dVar17) && !NAN(dVar1))) {
        uVar5 = vcmppd_avx512vl(auVar19,ZEXT816(0x43e0000000000000),5);
        uVar6 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar19,6);
        pGVar13 = (GCObject *)(ulong)((ushort)uVar6 & 3 | (ushort)uVar5 & 3);
        pGVar12 = (GCObject *)(long)dVar17;
      }
LAB_00125e93:
      if (((ulong)pGVar13 & 1) != 0) {
        return 0;
      }
    }
    else {
      if (uVar10 != 0x13) goto LAB_00125e93;
      pGVar12 = (t1->value_).gc;
    }
    uVar10 = 1;
    if (uVar9 == 3) {
      dVar1 = (t2->value_).n;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar1;
      auVar19 = vroundsd_avx(auVar20,auVar20,9);
      dVar17 = auVar19._0_8_;
      if ((dVar17 == dVar1) && (!NAN(dVar17) && !NAN(dVar1))) {
        uVar5 = vcmppd_avx512vl(auVar19,ZEXT816(0x43e0000000000000),5);
        uVar6 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar19,6);
        uVar10 = (ushort)uVar6 & 3 | (ushort)uVar5 & 3;
        pGVar13 = (GCObject *)(long)dVar17;
      }
LAB_00125f54:
      if ((uVar10 & 1) != 0) {
        return 0;
      }
    }
    else {
      if (uVar9 != 0x13) goto LAB_00125f54;
      pGVar13 = (t2->value_).gc;
    }
    bVar16 = pGVar12 == pGVar13;
    goto LAB_00126102;
  }
  uVar7 = 1;
  switch(uVar11) {
  case 0:
    goto switchD_00125dc8_caseD_0;
  case 1:
    if (uVar10 != 1) {
      pcVar14 = "((((t1))->tt_) == (1))";
LAB_001262ff:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2eb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar9 != 1) {
      pcVar14 = "((((t2))->tt_) == (1))";
      goto LAB_001262ff;
    }
    bVar16 = (t1->value_).b == (t2->value_).b;
    goto LAB_00126102;
  case 2:
    if (uVar10 != 2) {
      pcVar14 = "((((t1))->tt_) == (2))";
LAB_0012627f:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ec,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar9 != 2) {
      pcVar14 = "((((t2))->tt_) == (2))";
      goto LAB_0012627f;
    }
    break;
  case 3:
    if (uVar10 == 3) {
      if (uVar9 == 3) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (t1->value_).i;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (t2->value_).i;
        uVar5 = vcmpsd_avx512f(auVar18,auVar2,0);
        return (uint)uVar5 & 1;
      }
      pcVar14 = "((((t2))->tt_) == (((3) | ((0) << 4))))";
    }
    else {
      pcVar14 = "((((t1))->tt_) == (((3) | ((0) << 4))))";
    }
    __assert_fail(pcVar14,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x2ea,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
  case 4:
    if ((uVar10 & 0xf) != 4) {
      pcVar14 = "(((((((t1))->tt_)) & 0x0F)) == (4))";
LAB_001263fb:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar12 = (t1->value_).gc;
    if ((pGVar12->tt & 0xf) != 4) {
      pcVar14 = "(((((t1)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_001263fb;
    }
    if (pGVar12->tt != 4) {
      pcVar14 = 
      "((((void) sizeof (((((((((t1))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((t1))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((t1))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((t1)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((t1)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((t1)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((t1)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_001263fb;
    }
    if ((uVar9 & 0xf) != 4) {
      pcVar14 = "(((((((t2))->tt_)) & 0x0F)) == (4))";
      goto LAB_001263fb;
    }
    pGVar13 = (t2->value_).gc;
    if ((pGVar13->tt & 0xf) != 4) {
      pcVar14 = "(((((t2)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_001263fb;
    }
    goto LAB_001260a3;
  case 5:
    if (uVar10 != 0x8005) {
      pcVar14 = "((((t1))->tt_) == (((5) | (1 << 15))))";
LAB_001263dc:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar12 = (GCObject *)(t1->value_).f;
    if (pGVar12->tt != '\x05') {
      pcVar14 = "(((t1)->value_).gc)->tt == 5";
      goto LAB_001263dc;
    }
    if (uVar9 != 0x8005) {
      pcVar14 = "((((t2))->tt_) == (((5) | (1 << 15))))";
      goto LAB_001263dc;
    }
    if (((t2->value_).gc)->tt != '\x05') {
      pcVar14 = "(((t2)->value_).gc)->tt == 5";
      goto LAB_001263dc;
    }
    if (pGVar12 == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar15 = *(Table **)&pGVar12[2].tt;
    if ((pTVar15 == (Table *)0x0) || ((pTVar15->flags & 0x20) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(pTVar15,TM_EQ,L->l_G->tmname[5]);
    }
    if (f != (TValue *)0x0) goto LAB_001261e5;
    if (t2->tt_ != 0x8005) {
      pcVar14 = "((((t2))->tt_) == (((5) | (1 << 15))))";
LAB_0012647c:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
      pcVar14 = "(((t2)->value_).gc)->tt == 5";
      goto LAB_0012647c;
    }
    pTVar15 = *(Table **)((t2->value_).f + 0x28);
    goto LAB_001261be;
  case 6:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
switchD_00125dc8_caseD_6:
    if (-1 < (short)uVar10) {
      pcVar14 = "(((t1)->tt_) & (1 << 15))";
LAB_0012623c:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x307,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (-1 < (short)uVar3) {
      pcVar14 = "(((t2)->tt_) & (1 << 15))";
      goto LAB_0012623c;
    }
    break;
  case 7:
    if (uVar10 != 0x8007) {
      pcVar14 = "((((t1))->tt_) == (((7) | (1 << 15))))";
LAB_001263b4:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar12 = (GCObject *)(t1->value_).f;
    if (pGVar12->tt != '\a') {
      pcVar14 = "(((t1)->value_).gc)->tt == 7";
      goto LAB_001263b4;
    }
    if (uVar9 != 0x8007) {
      pcVar14 = "((((t2))->tt_) == (((7) | (1 << 15))))";
      goto LAB_001263b4;
    }
    if (((t2->value_).gc)->tt != '\a') {
      pcVar14 = "(((t2)->value_).gc)->tt == 7";
      goto LAB_001263b4;
    }
    if (pGVar12 == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar15 = (Table *)pGVar12[1].next;
    if ((pTVar15 == (Table *)0x0) || ((pTVar15->flags & 0x20) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(pTVar15,TM_EQ,L->l_G->tmname[5]);
    }
    if (f != (TValue *)0x0) goto LAB_001261e5;
    if (t2->tt_ != 0x8007) {
      pcVar14 = "((((t2))->tt_) == (((7) | (1 << 15))))";
LAB_0012645d:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
      pcVar14 = "(((t2)->value_).gc)->tt == 7";
      goto LAB_0012645d;
    }
    pTVar15 = *(Table **)((t2->value_).f + 0x10);
LAB_001261be:
    if ((pTVar15 == (Table *)0x0) || ((pTVar15->flags & 0x20) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(pTVar15,TM_EQ,L->l_G->tmname[5]);
    }
LAB_001261e5:
    if (f == (TValue *)0x0) {
      return 0;
    }
    luaT_callTM(L,f,t1,t2,L->top,1);
    LVar4 = L->top->tt_;
    if (LVar4 != 0) {
      if (LVar4 != 1) {
        return 1;
      }
      return (uint)((L->top->value_).b != 0);
    }
    return 0;
  case 0x13:
    if (uVar10 != 0x13) {
      pcVar14 = "((((t1))->tt_) == (((3) | ((1) << 4))))";
LAB_00126349:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2e9,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar9 != 0x13) {
      pcVar14 = "((((t2))->tt_) == (((3) | ((1) << 4))))";
      goto LAB_00126349;
    }
    break;
  case 0x14:
    if ((uVar10 & 0xf) == 4) {
      if ((((TString *)(t1->value_).gc)->tt & 0xf) == 4) {
        if ((uVar9 & 0xf) == 4) {
          if ((((TString *)(t2->value_).gc)->tt & 0xf) == 4) {
            iVar8 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
            return iVar8;
          }
          pcVar14 = "(((((t2)->value_).gc)->tt) & 0x0F) == 4";
        }
        else {
          pcVar14 = "(((((((t2))->tt_)) & 0x0F)) == (4))";
        }
      }
      else {
        pcVar14 = "(((((t1)->value_).gc)->tt) & 0x0F) == 4";
      }
    }
    else {
      pcVar14 = "(((((((t1))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar14,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
  case 0x15:
switchD_00125dc8_caseD_15:
    if ((uVar10 != 0x8015) && (uVar10 != 0x8025)) {
      pcVar14 = 
      "(((((t1))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t1))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_0012642c:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar12 = (t1->value_).gc;
    if ((pGVar12->tt != '\x15') && (pGVar12->tt != '%')) {
      pcVar14 = 
      "((((t1)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t1)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0012642c;
    }
    if ((uVar9 != 0x8015) && (uVar9 != 0x8025)) {
      pcVar14 = 
      "(((((t2))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t2))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
      goto LAB_0012642c;
    }
    pGVar13 = (t2->value_).gc;
    if ((pGVar13->tt != '\x15') && (pGVar13->tt != '%')) {
      pcVar14 = 
      "((((t2)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t2)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0012642c;
    }
LAB_001260a3:
    bVar16 = pGVar12 == pGVar13;
    goto LAB_00126102;
  case 0x16:
    if (uVar10 != 0x16) {
      pcVar14 = "((((t1))->tt_) == (((6) | ((1) << 4))))";
LAB_001262b3:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ed,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar9 != 0x16) {
      pcVar14 = "((((t2))->tt_) == (((6) | ((1) << 4))))";
      goto LAB_001262b3;
    }
    break;
  default:
    if (uVar11 == 0x25) goto switchD_00125dc8_caseD_15;
    if (uVar11 != 0x46) goto switchD_00125dc8_caseD_6;
    if ((uVar9 & 0x7f) != 0x46) {
      __assert_fail("((((t2)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ee,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
  }
  bVar16 = (t1->value_).gc == (t2->value_).gc;
LAB_00126102:
  uVar7 = (uint)bVar16;
switchD_00125dc8_caseD_0:
  return uVar7;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttype(t1) != ttype(t2)) {  /* not the same variant? */
    if (ttnov(t1) != ttnov(t2) || ttnov(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      lua_Integer i1, i2;  /* compare them as integers */
      return (tointegerns(t1, &i1) && tointegerns(t2, &i2) && i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttype(t1)) {
    case LUA_TNIL: return 1;
    case LUA_TNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_TNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_TBOOLEAN: return bvalue(t1) == bvalue(t2);  /* true must be 1 !! */
    case LUA_TLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_TLCF: return fvalue(t1) == fvalue(t2);
	case RAVI_TFCF: return fcfvalue(t1) == fcfvalue(t2);
    case LUA_TSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_TLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_TUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      if (arrvalue(t1) == arrvalue(t2)) return 1;
      else return 0;
    }
    case LUA_TTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  luaT_callTM(L, tm, t1, t2, L->top, 1);  /* call TM */
  return !l_isfalse(L->top);
}